

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O2

void __thiscall GlobOpt::OptNewScObject(GlobOpt *this,Instr **instrPtr,Value *srcVal)

{
  OpCode OVar1;
  Instr *this_00;
  Func *this_01;
  code *pcVar2;
  bool bVar3;
  uint sourceContextId;
  uint functionId;
  ProfiledInstr *pPVar4;
  JITTimeConstructorCache *this_02;
  undefined4 *puVar5;
  
  if (((((*instrPtr)->m_opcode == NewScObjectNoCtor) || ((*instrPtr)->m_opcode == NewScObject)) &&
      (this->prePassLoop == (Loop *)0x0)) && (bVar3 = DoObjTypeSpec(this), bVar3)) {
    sourceContextId = Func::GetSourceContextId(this->func);
    functionId = Func::GetLocalFunctionId(this->func);
    bVar3 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01441eb0,ObjTypeSpecNewObjPhase,sourceContextId,functionId);
    if ((!bVar3) && (this_00 = *instrPtr, this_00->m_kind == InstrKindProfiled)) {
      OVar1 = this_00->m_opcode;
      this_01 = this_00->m_func;
      pPVar4 = IR::Instr::AsProfiledInstr(this_00);
      this_02 = Func::GetConstructorCache(this_01,(pPVar4->u).field_3.fldInfoData.f1);
      if (this_02 != (JITTimeConstructorCache *)0x0) {
        bVar3 = JITTimeConstructorCache::IsTypeFinal(this_02);
        if ((bVar3) &&
           (bVar3 = JITTimeConstructorCache::CtorHasNoExplicitReturnValue(this_02), !bVar3)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                             ,0x669,
                             "(ctorCache == nullptr || !ctorCache->IsTypeFinal() || ctorCache->CtorHasNoExplicitReturnValue())"
                             ,
                             "ctorCache == nullptr || !ctorCache->IsTypeFinal() || ctorCache->CtorHasNoExplicitReturnValue()"
                            );
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar5 = 0;
        }
        bVar3 = JITTimeConstructorCache::SkipNewScObject(this_02);
        if (!bVar3) {
          if ((OVar1 != NewScObjectNoCtor) &&
             (bVar3 = JITTimeConstructorCache::IsTypeFinal(this_02), !bVar3)) {
            return;
          }
          GenerateBailAtOperation(this,instrPtr,BailOutFailedCtorGuardCheck);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void
GlobOpt::OptNewScObject(IR::Instr** instrPtr, Value* srcVal)
{
    IR::Instr *&instr = *instrPtr;

    if (!instr->IsNewScObjectInstr() || IsLoopPrePass() || !this->DoFieldRefOpts() || PHASE_OFF(Js::ObjTypeSpecNewObjPhase, this->func))
    {
        return;
    }

    bool isCtorInlined = instr->m_opcode == Js::OpCode::NewScObjectNoCtor;
    const JITTimeConstructorCache * ctorCache = instr->IsProfiledInstr() ?
        instr->m_func->GetConstructorCache(static_cast<Js::ProfileId>(instr->AsProfiledInstr()->u.profileId)) : nullptr;

    // TODO: OOP JIT, enable assert
    //Assert(ctorCache == nullptr || srcVal->GetValueInfo()->IsVarConstant() && Js::VarIs<Js::JavascriptFunction>(srcVal->GetValueInfo()->AsVarConstant()->VarValue()));
    Assert(ctorCache == nullptr || !ctorCache->IsTypeFinal() || ctorCache->CtorHasNoExplicitReturnValue());

    if (ctorCache != nullptr && !ctorCache->SkipNewScObject() && (isCtorInlined || ctorCache->IsTypeFinal()))
    {
        GenerateBailAtOperation(instrPtr, IR::BailOutFailedCtorGuardCheck);
    }
}